

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O3

int ixmlDocument_createAttributeEx(IXML_Document *doc,char *name,IXML_Attr **rtAttr)

{
  IXML_Attr *attr;
  char *pcVar1;
  int iVar2;
  
  attr = (IXML_Attr *)malloc(0x80);
  iVar2 = 0x66;
  if (attr != (IXML_Attr *)0x0) {
    if (doc == (IXML_Document *)0x0 || name == (char *)0x0) {
      ixmlAttr_free(attr);
      iVar2 = 0x69;
    }
    else {
      ixmlAttr_init(attr);
      (attr->n).nodeType = eATTRIBUTE_NODE;
      pcVar1 = strdup(name);
      (attr->n).nodeName = pcVar1;
      if (pcVar1 != (char *)0x0) {
        (attr->n).ownerDocument = doc;
        iVar2 = 0;
        goto LAB_001233a6;
      }
      ixmlAttr_free(attr);
    }
  }
  attr = (IXML_Attr *)0x0;
LAB_001233a6:
  *rtAttr = attr;
  return iVar2;
}

Assistant:

int ixmlDocument_createAttributeEx(
	IXML_Document *doc, const DOMString name, IXML_Attr **rtAttr)
{
	IXML_Attr *attrNode = NULL;
	int errCode = IXML_SUCCESS;

	attrNode = (IXML_Attr *)malloc(sizeof(IXML_Attr));
	if (attrNode == NULL) {
		errCode = IXML_INSUFFICIENT_MEMORY;
		goto ErrorHandler;
	}

	if (doc == NULL || name == NULL) {
		ixmlAttr_free(attrNode);
		attrNode = NULL;
		errCode = IXML_INVALID_PARAMETER;
		goto ErrorHandler;
	}

	ixmlAttr_init(attrNode);
	attrNode->n.nodeType = eATTRIBUTE_NODE;

	/* set the node fields */
	attrNode->n.nodeName = strdup(name);
	if (attrNode->n.nodeName == NULL) {
		ixmlAttr_free(attrNode);
		attrNode = NULL;
		errCode = IXML_INSUFFICIENT_MEMORY;
		goto ErrorHandler;
	}

	attrNode->n.ownerDocument = doc;

ErrorHandler:
	*rtAttr = attrNode;
	return errCode;
}